

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rename.c
# Opt level: O2

int rename(char *__old,char *__new)

{
  _PDCLIB_file_t *p_Var1;
  int iVar2;
  _PDCLIB_file_t **pp_Var3;
  
  mtx_lock(&_PDCLIB_filelist_mtx);
  pp_Var3 = &_PDCLIB_filelist;
  do {
    p_Var1 = *pp_Var3;
    if (p_Var1 == (_PDCLIB_file_t *)0x0) {
      mtx_unlock(&_PDCLIB_filelist_mtx);
      iVar2 = _PDCLIB_rename(__old,__new);
      return iVar2;
    }
    if (p_Var1->filename != (char *)0x0) {
      iVar2 = strcmp(p_Var1->filename,__old);
      if (iVar2 == 0) {
        mtx_unlock(&_PDCLIB_filelist_mtx);
        return -1;
      }
    }
    pp_Var3 = &p_Var1->next;
  } while( true );
}

Assistant:

int rename( const char * oldpath, const char * newpath )
{
    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );

    {
        struct _PDCLIB_file_t * current = _PDCLIB_filelist;

        while ( current != NULL )
        {
            if ( ( current->filename != NULL ) && ( strcmp( current->filename, oldpath ) == 0 ) )
            {
                /* File of that name currently open. Do not rename. */
                _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
                return EOF;
            }

            current = current->next;
        }
    }

    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    return _PDCLIB_rename( oldpath, newpath );
}